

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

QString * __thiscall
QLocale::languageToCode
          (QString *__return_storage_ptr__,QLocale *this,Language language,
          LanguageCodeTypes codeTypes)

{
  DataPointer *pDVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  qsizetype qVar6;
  array<char,_4UL> aVar7;
  undefined4 in_register_0000000c;
  storage_type *psVar8;
  undefined6 in_register_00000012;
  QString *this_00;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QString local_38;
  _Type local_1c;
  long local_18;
  
  psVar8 = (storage_type *)
           CONCAT44(in_register_0000000c,
                    codeTypes.super_QFlagsStorageHelper<QLocale::LanguageCodeType,_4>.
                    super_QFlagsStorage<QLocale::LanguageCodeType>.i);
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_1c[0] = -0x56;
  local_1c[1] = -0x56;
  local_1c[2] = -0x56;
  local_1c[3] = -0x56;
  aVar7 = QLocalePrivate::languageToCode
                    ((Language)this,
                     (QFlagsStorageHelper<QLocale::LanguageCodeType,_4>)
                     SUB84(CONCAT62(in_register_00000012,language),0));
  local_1c[0] = aVar7._M_elems[0];
  local_1c[1] = aVar7._M_elems[1];
  local_1c[2] = aVar7._M_elems[2];
  local_1c[3] = aVar7._M_elems[3];
  this_00 = (QString *)0xffffffffffffffff;
  do {
    pDVar1 = &this_00->d;
    this_00 = (QString *)((long)&(this_00->d).d + 1);
  } while ((local_1c + 1)[(long)&pDVar1->d] != '\0');
  ba.m_data = psVar8;
  ba.m_size = (qsizetype)local_1c;
  QString::fromLatin1(&local_38,this_00,ba);
  qVar6 = local_38.d.size;
  uVar2 = local_38.d.d._0_4_;
  uVar3 = local_38.d.d._4_4_;
  uVar4 = local_38.d.ptr._0_4_;
  uVar5 = local_38.d.ptr._4_4_;
  local_38.d.d = (Data *)0x0;
  local_38.d.ptr = (char16_t *)0x0;
  *(undefined4 *)&(__return_storage_ptr__->d).d = uVar2;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = uVar3;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = uVar4;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = uVar5;
  local_38.d.size = 0;
  (__return_storage_ptr__->d).size = qVar6;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocale::languageToCode(Language language, LanguageCodeTypes codeTypes)
{
    const auto code = QLocalePrivate::languageToCode(language, codeTypes);
    return QLatin1StringView{code.data()};
}